

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.cpp
# Opt level: O2

Class * __thiscall chatra::Reader::readClass(Reader *this)

{
  int iVar1;
  mapped_type *ppCVar2;
  unsigned_long __n;
  mapped_type pCVar3;
  undefined8 *puVar4;
  Node *local_20;
  
  iVar1 = readRawInteger<int>(this);
  if (iVar1 == 0) {
    pCVar3 = (Class *)0x0;
  }
  else {
    if (iVar1 == 2) {
      __n = readRawInteger<unsigned_long>(this);
      ppCVar2 = std::vector<const_chatra::Class_*,_std::allocator<const_chatra::Class_*>_>::at
                          (&this->classMap,__n);
    }
    else {
      if (iVar1 != 1) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(0x28);
        puVar4[2] = 0;
        puVar4[3] = 0;
        puVar4[4] = 0;
        puVar4[1] = puVar4 + 3;
        *(undefined1 *)(puVar4 + 3) = 0;
        *puVar4 = &PTR__NativeException_0023ce78;
        __cxa_throw(puVar4,&IllegalArgumentException::typeinfo,NativeException::~NativeException);
      }
      local_20 = readNode(this);
      ppCVar2 = std::__detail::
                _Map_base<chatra::Node_*,_std::pair<chatra::Node_*const,_const_chatra::Class_*>,_std::allocator<std::pair<chatra::Node_*const,_const_chatra::Class_*>_>,_std::__detail::_Select1st,_std::equal_to<chatra::Node_*>,_std::hash<chatra::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::at((_Map_base<chatra::Node_*,_std::pair<chatra::Node_*const,_const_chatra::Class_*>,_std::allocator<std::pair<chatra::Node_*const,_const_chatra::Class_*>_>,_std::__detail::_Select1st,_std::equal_to<chatra::Node_*>,_std::hash<chatra::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)&this->nodeClassMap,&local_20);
    }
    pCVar3 = *ppCVar2;
  }
  return pCVar3;
}

Assistant:

const Class* Reader::readClass() {
	chatra_assert(entityMapEnabled);
	CHATRA_RESTORE_TYPE_TAG(Class);

	switch (read<int>()) {
	case 0:  return nullptr;
	case 1:  return nodeClassMap.at(read<Node*>());
	case 2:  return classMap.at(read<size_t>());
	default:
		throw IllegalArgumentException();
	}
}